

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O2

Read<int> __thiscall Omega_h::Comm::sources(Comm *this)

{
  void *extraout_RDX;
  long in_RSI;
  Read<int> RVar1;
  
  Write<int>::Write((Write<int> *)this,(Write<int> *)(in_RSI + 8));
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I32> Comm::sources() const { return srcs_; }